

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_classes.h
# Opt level: O0

t_max_err class_addmethod(t_class *c,method m,char *name,...)

{
  t_messlist *this;
  mapped_type *pp_Var1;
  allocator<char> local_49;
  key_type local_48;
  t_messlist *local_28;
  t_mock_messlist *mock_messlist;
  char *name_local;
  method m_local;
  t_class *c_local;
  
  this = c->c_messlist;
  local_28 = this;
  mock_messlist = (t_mock_messlist *)name;
  name_local = (char *)m;
  m_local = (method)c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  pp_Var1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...)>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____)>_>_>
                          *)this,&local_48);
  *pp_Var1 = m;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return 0;
}

Assistant:

MOCK_EXPORT t_max_err class_addmethod(t_class *c, const method m, const char *name, ...)
{
    t_mock_messlist *mock_messlist = (t_mock_messlist*)c->c_messlist;
    (*mock_messlist)[name] = m;
    return 0;
}